

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thingdef_properties.cpp
# Opt level: O3

void HandleDeprecatedFlags(AActor *defaults,PClassActor *info,bool set,int index)

{
  ushort uVar1;
  PClassActor *pPVar2;
  int iVar3;
  double dVar4;
  FName local_c;
  
  switch(index) {
  case 1:
    iVar3 = 0x9f;
    goto LAB_0069ec64;
  case 2:
    iVar3 = 0x33;
LAB_0069ec64:
    if (!set) {
      iVar3 = 0;
    }
    (defaults->DamageType).super_FName.Index = iVar3;
    break;
  case 3:
    if (set) {
      dVar4 = 0.125;
    }
    else {
LAB_0069eca4:
      dVar4 = 1.0;
    }
    goto LAB_0069ed4b;
  case 4:
    if (set) {
      dVar4 = 196.0;
    }
    else {
      dVar4 = 0.0;
    }
    defaults->meleethreshold = dVar4;
    break;
  case 5:
    if (set) {
      dVar4 = 896.0;
    }
    else {
      dVar4 = 0.0;
    }
    defaults->maxtargetrange = dVar4;
    break;
  case 6:
    if (set) {
      pPVar2 = FindClassTentative("PickupFlash",AActor::RegistrationInfo.MyClass);
      defaults[1].super_DThinker.PrevThinker = (DThinker *)pPVar2;
    }
    else {
      defaults[1].super_DThinker.PrevThinker = (DThinker *)0x0;
    }
    break;
  case 7:
    if (!set) goto LAB_0069eca4;
    dVar4 = 0.25;
LAB_0069ed4b:
    defaults->Gravity = dVar4;
    break;
  case 8:
    local_c.Index = 0x9f;
    if (set) {
      dVar4 = 0.5;
    }
    else {
      dVar4 = 1.0;
    }
    PClassActor::SetDamageFactor(info,&local_c,dVar4);
    break;
  case 9:
    uVar1 = (defaults->BounceFlags).Value & 0xef10;
    (defaults->BounceFlags).Value = uVar1;
    if (!set) {
      return;
    }
    uVar1 = uVar1 | 0xc6;
    goto LAB_0069ecef;
  case 10:
    uVar1 = (defaults->BounceFlags).Value & 0xef10;
    (defaults->BounceFlags).Value = uVar1;
    if (!set) {
      return;
    }
    uVar1 = uVar1 | 0x8f;
    goto LAB_0069ecef;
  case 0xb:
    uVar1 = (defaults->BounceFlags).Value & 0xef10;
    (defaults->BounceFlags).Value = uVar1;
    if (!set) {
      return;
    }
    uVar1 = uVar1 | 0xaf;
LAB_0069ecef:
    (defaults->BounceFlags).Value = uVar1;
    break;
  case 0xc:
    *(uint *)&defaults[1].super_DThinker.super_DObject.ObjNext = (uint)!set;
  }
  return;
}

Assistant:

void HandleDeprecatedFlags(AActor *defaults, PClassActor *info, bool set, int index)
{
	switch (index)
	{
	case DEPF_FIREDAMAGE:
		defaults->DamageType = set? NAME_Fire : NAME_None;
		break;
	case DEPF_ICEDAMAGE:
		defaults->DamageType = set? NAME_Ice : NAME_None;
		break;
	case DEPF_LOWGRAVITY:
		defaults->Gravity = set ? 1. / 8 : 1.;
		break;
	case DEPF_SHORTMISSILERANGE:
		defaults->maxtargetrange = set? 896. : 0.;
		break;
	case DEPF_LONGMELEERANGE:
		defaults->meleethreshold = set? 196. : 0.;
		break;
	case DEPF_QUARTERGRAVITY:
		defaults->Gravity = set ? 1. / 4 : 1.;
		break;
	case DEPF_FIRERESIST:
		info->SetDamageFactor(NAME_Fire, set ? 0.5 : 1.);
		break;
	// the bounce flags will set the compatibility bounce modes to remain compatible
	case DEPF_HERETICBOUNCE:
		defaults->BounceFlags &= ~(BOUNCE_TypeMask|BOUNCE_UseSeeSound);
		if (set) defaults->BounceFlags |= BOUNCE_HereticCompat;
		break;
	case DEPF_HEXENBOUNCE:
		defaults->BounceFlags &= ~(BOUNCE_TypeMask|BOUNCE_UseSeeSound);
		if (set) defaults->BounceFlags |= BOUNCE_HexenCompat;
		break;
	case DEPF_DOOMBOUNCE:
		defaults->BounceFlags &= ~(BOUNCE_TypeMask|BOUNCE_UseSeeSound);
		if (set) defaults->BounceFlags |= BOUNCE_DoomCompat;
		break;
	case DEPF_PICKUPFLASH:
		if (set)
		{
			static_cast<AInventory*>(defaults)->PickupFlash = FindClassTentative("PickupFlash", RUNTIME_CLASS(AActor));
		}
		else
		{
			static_cast<AInventory*>(defaults)->PickupFlash = NULL;
		}
		break;
	case DEPF_INTERHUBSTRIP: // Old system was 0 or 1, so if the flag is cleared, assume 1.
		static_cast<AInventory*>(defaults)->InterHubAmount = set ? 0 : 1;
	default:
		break;	// silence GCC
	}
}